

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalJacobianPreInt
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  PointerType pdVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  char *__function;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined8 *puVar24;
  double *pdVar25;
  undefined1 (*pauVar26) [64];
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  Matrix<double,__1,__1,_0,__1,__1> PI2;
  Matrix<double,__1,__1,_0,__1,__1> K2;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow0;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow2;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow1;
  Matrix3xN e_bar;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar_dot;
  double *local_19e8;
  assign_op<double,_double> local_19d9;
  long local_19d8;
  DenseStorage<double,__1,__1,__1,_0> local_19d0;
  long local_19b0;
  long local_19a8;
  ulong local_19a0;
  long local_1998;
  ChElementShellANCF_3833 *local_1990;
  long local_1988;
  double local_1980;
  undefined8 uStack_1978;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_1970;
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [64];
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [128];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  DenseStorage<double,__1,__1,__1,_0> *local_14c0;
  Matrix3xN *pMStack_14b8;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_14b0;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_1980 = Kfactor;
  uStack_1978 = in_XMM0_Qb;
  CalcCoordMatrix(this,(Matrix3xN *)local_1700);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_2c0);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = this->m_Alpha;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = Rfactor;
  auVar18._8_8_ = uStack_1978;
  auVar18._0_8_ = local_1980;
  auVar32 = vfmadd213sd_fma(auVar46,auVar45,auVar18);
  local_14c0 = auVar32._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = this->m_Alpha * local_1980;
  auVar33 = vbroadcastsd_avx512f(auVar32);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_14c0;
  auVar34 = vbroadcastsd_avx512f(auVar4);
  auVar35 = vmulpd_avx512f(auVar33,local_2c0);
  auVar36 = vmulpd_avx512f(auVar33,local_280);
  auVar37 = vmulpd_avx512f(auVar34,local_1700._0_64_);
  auVar38 = vmulpd_avx512f(auVar34,local_1700._64_64_);
  auVar39 = vmulpd_avx512f(auVar34,local_1680);
  auVar40 = vmulpd_avx512f(auVar34,local_1640);
  auVar41 = vmulpd_avx512f(auVar34,local_1600);
  auVar42 = vmulpd_avx512f(auVar34,local_15c0);
  auVar43 = vmulpd_avx512f(auVar34,local_1580);
  auVar44 = vmulpd_avx512f(auVar34,local_1540);
  auVar34 = vmulpd_avx512f(auVar34,local_1500);
  local_1940 = vaddpd_avx512f(auVar37,auVar35);
  local_1900 = vaddpd_avx512f(auVar38,auVar36);
  auVar35 = vmulpd_avx512f(auVar33,local_240);
  local_18c0 = vaddpd_avx512f(auVar39,auVar35);
  auVar35 = vmulpd_avx512f(auVar33,local_200);
  local_17c0 = vaddpd_avx512f(auVar40,auVar35);
  auVar35 = vmulpd_avx512f(auVar33,local_1c0);
  local_1780 = vaddpd_avx512f(auVar41,auVar35);
  auVar35 = vmulpd_avx512f(auVar33,local_180);
  local_1740 = vaddpd_avx512f(auVar42,auVar35);
  auVar35 = vmulpd_avx512f(auVar33,local_140);
  local_1880 = vaddpd_avx512f(auVar43,auVar35);
  auVar35 = vmulpd_avx512f(auVar33,local_100);
  auVar33 = vmulpd_avx512f(auVar33,local_c0);
  local_19d0.m_cols = 0;
  local_1840 = vaddpd_avx512f(auVar44,auVar35);
  local_1800 = vaddpd_avx512f(auVar34,auVar33);
  local_19d0.m_data = (double *)0x0;
  local_19d0.m_rows = 0;
  pMStack_14b8 = (Matrix3xN *)local_1700;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_19d0,0x1440,9,0x240);
  auVar38 = _DAT_009b0a00;
  auVar37 = _DAT_009b09c0;
  auVar36 = _DAT_009b0980;
  auVar35 = _DAT_009b0940;
  auVar34 = _DAT_009b0900;
  auVar33 = _DAT_009b08c0;
  lVar20 = 0;
  lVar21 = 0;
  do {
    if ((local_19d0.m_rows < 3) || (lVar23 = lVar21 * 0x18 + 0x18, local_19d0.m_cols < lVar23)) {
LAB_00759cf6:
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 24>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 24, InnerPanel = false]"
      ;
      goto LAB_00759ce9;
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(local_1700 + lVar21 * 8);
    auVar39 = vbroadcastsd_avx512f(auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(local_1640 + lVar21 * 8);
    auVar40 = vbroadcastsd_avx512f(auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(local_1580 + lVar21 * 8);
    auVar41 = vbroadcastsd_avx512f(auVar7);
    lVar27 = 0;
    pauVar26 = (undefined1 (*) [64])&local_14c0;
    do {
      auVar42 = *(undefined1 (*) [64])(local_1940 + lVar27 * 8);
      lVar27 = lVar27 + 8;
      auVar43 = vmulpd_avx512f(auVar39,auVar42);
      auVar44 = vmulpd_avx512f(auVar40,auVar42);
      auVar42 = vmulpd_avx512f(auVar41,auVar42);
      vpermt2pd_avx512f(auVar33,auVar44);
      vpermt2pd_avx512f(auVar35,auVar44);
      vpermt2pd_avx512f(auVar37,auVar43);
      auVar43 = vpermt2pd_avx512f(auVar34,auVar42);
      auVar44 = vpermt2pd_avx512f(auVar36,auVar42);
      auVar42 = vpermt2pd_avx512f(auVar38,auVar42);
      pauVar26[2] = auVar42;
      pauVar26[1] = auVar44;
      *pauVar26 = auVar43;
      pauVar26 = pauVar26 + 3;
    } while (lVar27 != 0x18);
    puVar24 = (undefined8 *)((long)local_19d0.m_data + local_19d0.m_rows * lVar20 + 0x10);
    lVar27 = 0x10;
    do {
      uVar2 = *(undefined8 *)(local_1500 + lVar27 + 0x38);
      puVar24[-2] = *(undefined8 *)(local_1500 + lVar27 + 0x30);
      puVar24[-1] = uVar2;
      puVar1 = (undefined8 *)((long)&local_14c0 + lVar27);
      lVar27 = lVar27 + 0x18;
      *puVar24 = *puVar1;
      puVar24 = puVar24 + local_19d0.m_rows;
    } while (lVar27 != 0x250);
    if ((local_19d0.m_rows < 6) || (local_19d0.m_cols < lVar23)) goto LAB_00759cf6;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(local_1700 + lVar21 * 8);
    auVar39 = vbroadcastsd_avx512f(auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(local_1640 + lVar21 * 8);
    auVar40 = vbroadcastsd_avx512f(auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(local_1580 + lVar21 * 8);
    auVar41 = vbroadcastsd_avx512f(auVar10);
    lVar27 = 0;
    pauVar26 = (undefined1 (*) [64])&local_14c0;
    do {
      auVar42 = *(undefined1 (*) [64])(local_17c0 + lVar27 * 8);
      lVar27 = lVar27 + 8;
      auVar43 = vmulpd_avx512f(auVar39,auVar42);
      auVar44 = vmulpd_avx512f(auVar40,auVar42);
      auVar42 = vmulpd_avx512f(auVar41,auVar42);
      vpermt2pd_avx512f(auVar33,auVar44);
      vpermt2pd_avx512f(auVar35,auVar44);
      vpermt2pd_avx512f(auVar37,auVar43);
      auVar43 = vpermt2pd_avx512f(auVar34,auVar42);
      auVar44 = vpermt2pd_avx512f(auVar36,auVar42);
      auVar42 = vpermt2pd_avx512f(auVar38,auVar42);
      pauVar26[2] = auVar42;
      pauVar26[1] = auVar44;
      *pauVar26 = auVar43;
      pauVar26 = pauVar26 + 3;
    } while (lVar27 != 0x18);
    puVar24 = (undefined8 *)((long)local_19d0.m_data + local_19d0.m_rows * lVar20 + 0x28);
    lVar27 = 0x10;
    do {
      uVar2 = *(undefined8 *)(local_1500 + lVar27 + 0x38);
      puVar24[-2] = *(undefined8 *)(local_1500 + lVar27 + 0x30);
      puVar24[-1] = uVar2;
      puVar1 = (undefined8 *)((long)&local_14c0 + lVar27);
      lVar27 = lVar27 + 0x18;
      *puVar24 = *puVar1;
      puVar24 = puVar24 + local_19d0.m_rows;
    } while (lVar27 != 0x250);
    if ((local_19d0.m_rows < 9) || (local_19d0.m_cols < lVar23)) goto LAB_00759cf6;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)(local_1700 + lVar21 * 8);
    auVar39 = vbroadcastsd_avx512f(auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)(local_1640 + lVar21 * 8);
    auVar40 = vbroadcastsd_avx512f(auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)(local_1580 + lVar21 * 8);
    auVar41 = vbroadcastsd_avx512f(auVar13);
    lVar23 = 0;
    pauVar26 = (undefined1 (*) [64])&local_14c0;
    do {
      auVar42 = *(undefined1 (*) [64])(local_1880 + lVar23 * 8);
      lVar23 = lVar23 + 8;
      auVar43 = vmulpd_avx512f(auVar39,auVar42);
      auVar44 = vmulpd_avx512f(auVar40,auVar42);
      auVar42 = vmulpd_avx512f(auVar41,auVar42);
      vpermt2pd_avx512f(auVar33,auVar44);
      vpermt2pd_avx512f(auVar35,auVar44);
      vpermt2pd_avx512f(auVar37,auVar43);
      auVar43 = vpermt2pd_avx512f(auVar34,auVar42);
      auVar44 = vpermt2pd_avx512f(auVar36,auVar42);
      auVar42 = vpermt2pd_avx512f(auVar38,auVar42);
      pauVar26[2] = auVar42;
      pauVar26[1] = auVar44;
      *pauVar26 = auVar43;
      pauVar26 = pauVar26 + 3;
    } while (lVar23 != 0x18);
    puVar24 = (undefined8 *)((long)local_19d0.m_data + local_19d0.m_rows * lVar20 + 0x40);
    lVar23 = 0x10;
    do {
      uVar2 = *(undefined8 *)(local_1500 + lVar23 + 0x38);
      puVar24[-2] = *(undefined8 *)(local_1500 + lVar23 + 0x30);
      puVar24[-1] = uVar2;
      puVar1 = (undefined8 *)((long)&local_14c0 + lVar23);
      lVar23 = lVar23 + 0x18;
      *puVar24 = *puVar1;
      puVar24 = puVar24 + local_19d0.m_rows;
    } while (lVar23 != 0x250);
    lVar21 = lVar21 + 1;
    lVar20 = lVar20 + 0xc0;
  } while (lVar21 != 0x18);
  pMStack_14b0 = &this->m_O2;
  local_14c0 = &local_19d0;
  if (local_19d0.m_cols !=
      (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
     ) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  local_1990 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_19a8,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_14c0);
  lVar21 = 0;
  local_19e8 = (double *)(local_19a8 + 0x40);
  local_1988 = local_19a0 * 8;
  local_19d8 = 8;
  local_19b0 = 0x10;
  lVar20 = 0;
  while (2 < (long)local_19a0) {
    lVar23 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
    pdVar14 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data;
    lVar27 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value;
    lVar29 = lVar23 * local_19d8;
    lVar30 = lVar23 * local_19b0;
    lVar23 = lVar23 * lVar21;
    lVar22 = 2;
    pdVar25 = local_19e8;
    lVar28 = lVar20;
    do {
      if (local_1998 <= lVar28) goto LAB_00759c9e;
      if ((lVar27 < lVar20 * 3 + 3) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar22 + -2)) {
LAB_00759cd4:
        __function = 
        "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00759ce9;
      }
      *(double *)((long)pdVar14 + lVar22 * 8 + lVar23 + -0x10) = pdVar25[-8];
      *(double *)((long)pdVar14 + lVar22 * 8 + lVar29 + -0x10) = pdVar25[-7];
      *(double *)((long)pdVar14 + lVar22 * 8 + lVar30 + -0x10) = pdVar25[-6];
      if ((local_19a0 < 6) || (local_1998 <= lVar28)) goto LAB_00759c9e;
      if ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar22 + -1) goto LAB_00759cd4;
      *(double *)((long)pdVar14 + lVar22 * 8 + lVar23 + -8) = pdVar25[-5];
      *(double *)((long)pdVar14 + lVar22 * 8 + lVar29 + -8) = pdVar25[-4];
      *(double *)((long)pdVar14 + lVar22 * 8 + lVar30 + -8) = pdVar25[-3];
      if ((local_19a0 < 9) || (local_1998 <= lVar28)) goto LAB_00759c9e;
      if ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar22) goto LAB_00759cd4;
      lVar28 = lVar28 + 0x18;
      *(double *)((long)pdVar14 + lVar22 * 8 + lVar23) = pdVar25[-2];
      *(double *)((long)pdVar14 + lVar22 * 8 + lVar29) = pdVar25[-1];
      uVar2 = *pdVar25;
      pdVar25 = pdVar25 + local_19a0 * 0x18;
      *(undefined8 *)((long)pdVar14 + lVar22 * 8 + lVar30) = uVar2;
      lVar22 = lVar22 + 3;
    } while (lVar22 != 0x4a);
    local_19d8 = local_19d8 + 0x18;
    local_19b0 = local_19b0 + 0x18;
    lVar20 = lVar20 + 1;
    lVar21 = lVar21 + 0x18;
    local_19e8 = local_19e8 + local_19a0;
    if (lVar20 == 0x18) {
      local_1970.m_lhs.m_cols.m_value =
           (local_1990->m_K13Compact).
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      local_1970.m_lhs.m_rows.m_value =
           (local_1990->m_K13Compact).
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      if ((local_1970.m_lhs.m_cols.m_value | local_1970.m_lhs.m_rows.m_value) < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                     );
      }
      auVar19._8_8_ = uStack_1978;
      auVar19._0_8_ = local_1980;
      local_1970.m_rhs = &local_1990->m_K13Compact;
      auVar17._8_8_ = 0x8000000000000000;
      auVar17._0_8_ = 0x8000000000000000;
      auVar32 = vxorpd_avx512vl(auVar19,auVar17);
      local_1970.m_lhs.m_functor.m_other = (double)vmovlpd_avx(auVar32);
      if ((local_1970.m_lhs.m_rows.m_value != 0x18) || (local_1970.m_lhs.m_cols.m_value != 0x18)) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, 24, 24, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 24, 24, 1>]"
                     );
      }
      local_19e8 = (double *)&local_14c0;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,24,24,1,24,24>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,_24,_24,_1,_24,_24> *)local_19e8,&local_1970,&local_19d9);
      uVar15 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_rows.m_value;
      lVar20 = 8;
      lVar21 = 0;
      lVar23 = 0;
      local_19d8 = 0x10;
      while (lVar23 * 3 < (long)uVar15) {
        lVar27 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        pdVar14 = (H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        uVar16 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value;
        uVar31 = 2;
        pdVar25 = local_19e8;
        do {
          if (((((long)uVar16 <= (long)(uVar31 - 2)) ||
               (*(double *)((long)pdVar14 + uVar31 * 8 + lVar27 * lVar21 + -0x10) =
                     *pdVar25 + *(double *)((long)pdVar14 + uVar31 * 8 + lVar27 * lVar21 + -0x10),
               uVar15 <= lVar23 * 3 + 1U)) || (uVar16 <= uVar31 - 1)) ||
             ((*(double *)((long)pdVar14 + uVar31 * 8 + lVar27 * lVar20 + -8) =
                    *pdVar25 + *(double *)((long)pdVar14 + uVar31 * 8 + lVar27 * lVar20 + -8),
              uVar15 <= lVar23 * 3 + 2U || (uVar16 <= uVar31)))) goto LAB_00759cb5;
          dVar3 = *pdVar25;
          pdVar25 = pdVar25 + 1;
          *(double *)((long)pdVar14 + uVar31 * 8 + lVar27 * local_19d8) =
               dVar3 + *(double *)((long)pdVar14 + uVar31 * 8 + lVar27 * local_19d8);
          uVar31 = uVar31 + 3;
        } while (uVar31 != 0x4a);
        local_19d8 = local_19d8 + 0x18;
        local_19e8 = local_19e8 + 0x18;
        lVar23 = lVar23 + 1;
        lVar20 = lVar20 + 0x18;
        lVar21 = lVar21 + 0x18;
        if (lVar23 == 0x18) {
          if (local_19a8 != 0) {
            free(*(void **)(local_19a8 + -8));
          }
          if (local_19d0.m_data != (double *)0x0) {
            free((void *)local_19d0.m_data[-1]);
          }
          return;
        }
      }
LAB_00759cb5:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                   );
    }
  }
LAB_00759c9e:
  __function = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00759ce9:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalJacobianPreInt(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  This makes this method well suited for applications
    // with many discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature
    // points used throughout the entire element.  Since computationally expensive quantities are required for both the
    // generalized internal force vector and its Jacobian, these values were cached for reuse during this Jacobian
    // calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> PI2;
    PI2.resize(9, NSF * NSF);

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            H(3 * i, 3 * j) += K_K13Compact(i, j);
            H(3 * i + 1, 3 * j + 1) += K_K13Compact(i, j);
            H(3 * i + 2, 3 * j + 2) += K_K13Compact(i, j);
        }
    }
}